

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_writer.h
# Opt level: O0

void __thiscall
xray_re::xr_ini_writer::
w_ini_seq<std::vector<xray_re::_vector3<float>,std::allocator<xray_re::_vector3<float>>>>
          (xr_ini_writer *this,
          vector<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_> *container,
          char *prefix)

{
  bool bVar1;
  int iVar2;
  reference p_Var3;
  void *__buf;
  uint local_43c;
  int n;
  uint32_t id;
  const_iterator end;
  const_iterator it;
  char buf [1024];
  char *prefix_local;
  vector<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_> *container_local;
  xr_ini_writer *this_local;
  
  end = std::vector<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>::begin
                  (container);
  _n = std::vector<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>::end
                 (container);
  local_43c = 0;
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&end,(__normal_iterator<const_xray_re::_vector3<float>_*,_std::vector<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>_>
                             *)&n);
    if (!bVar1) break;
    iVar2 = snprintf((char *)&it,0x400,"%s_%04d",prefix,(ulong)local_43c);
    if (0 < iVar2) {
      p_Var3 = __gnu_cxx::
               __normal_iterator<const_xray_re::_vector3<float>_*,_std::vector<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>_>
               ::operator*(&end);
      write(this,(int)&it,__buf,(ulong)(uint)(p_Var3->field_0).field_0.z);
    }
    local_43c = local_43c + 1;
    __gnu_cxx::
    __normal_iterator<const_xray_re::_vector3<float>_*,_std::vector<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>_>
    ::operator++(&end);
  }
  return;
}

Assistant:

inline void xr_ini_writer::w_ini_seq(const T& container, const char* prefix)
{
	char buf[1024];

	typename T::const_iterator it = container.begin(), end = container.end();
	for (uint32_t id = 0; it != end; ++it) {
#if defined(_MSC_VER) && _MSC_VER >= 1400
		int n = sprintf_s(buf, sizeof(buf), "%s_%04d", prefix, id);
#else
		int n = snprintf(buf, sizeof(buf), "%s_%04d", prefix, id);
#endif
		if (n > 0)
			write(buf, *it);
		id++;
	}
}